

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test10::prepareFunctions(GPUShaderFP64Test10 *this)

{
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  *this_00;
  uint in_EAX;
  functionEnum *pfVar1;
  iterator iVar2;
  undefined8 uStack_18;
  
  this_00 = &this->m_functions;
  uStack_18 = (ulong)in_EAX;
  iVar2._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pfVar1 = (this->m_functions).
           super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_ABS;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(1,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_CEIL;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(2,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_CLAMP;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(3,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_CLAMP_AGAINST_SCALAR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(4,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_CROSS;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(5,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_DETERMINANT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(6,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_DISTANCE;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(7,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_DOT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(8,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_EQUAL;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(9,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_FACEFORWARD;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(10,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_FLOOR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0xb,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_FMA;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0xc,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_FRACT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0xd,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_FREXP;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0xe,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_GREATERTHAN;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0xf,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_GREATERTHANEQUAL;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x10,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_INVERSE;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x11,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_INVERSESQRT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x12,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_LDEXP;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x13,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_LESSTHAN;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x14,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_LESSTHANEQUAL;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x15,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_LENGTH;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x16,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MATRIXCOMPMULT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x17,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MAX;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x18,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MAX_AGAINST_SCALAR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x19,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MIN;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x1a,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MIN_AGAINST_SCALAR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x1b,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MIX;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x1c,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MOD;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x1d,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MOD_AGAINST_SCALAR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x1e,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_MODF;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x1f,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_NORMALIZE;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x20,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_NOTEQUAL;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x21,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_OUTERPRODUCT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x22,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_PACKDOUBLE2X32;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x23,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_REFLECT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x24,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_REFRACT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x25,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_ROUND;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x26,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_ROUNDEVEN;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x27,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_SIGN;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x28,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_SMOOTHSTEP;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x29,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_SMOOTHSTEP_AGAINST_SCALAR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x2a,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_SQRT;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x2b,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_STEP;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x2c,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_STEP_AGAINST_SCALAR;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x2d,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_TRANSPOSE;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x2e,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_TRUNC;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x2f,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_UNPACKDOUBLE2X32;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x30,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
    iVar2._M_current =
         (this->m_functions).
         super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pfVar1 = (this->m_functions).
             super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = FUNCTION_ISNAN;
    iVar2._M_current = iVar2._M_current + 1;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  uStack_18 = CONCAT44(0x31,(undefined4)uStack_18);
  if (iVar2._M_current == pfVar1) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar2,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar2._M_current = FUNCTION_ISINF;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareFunctions()
{
	m_functions.push_back(FUNCTION_ABS);
	m_functions.push_back(FUNCTION_CEIL);
	m_functions.push_back(FUNCTION_CLAMP);
	m_functions.push_back(FUNCTION_CLAMP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_CROSS);
	m_functions.push_back(FUNCTION_DETERMINANT);
	m_functions.push_back(FUNCTION_DISTANCE);
	m_functions.push_back(FUNCTION_DOT);
	m_functions.push_back(FUNCTION_EQUAL);
	m_functions.push_back(FUNCTION_FACEFORWARD);
	m_functions.push_back(FUNCTION_FLOOR);
	m_functions.push_back(FUNCTION_FMA);
	m_functions.push_back(FUNCTION_FRACT);
	m_functions.push_back(FUNCTION_FREXP);
	m_functions.push_back(FUNCTION_GREATERTHAN);
	m_functions.push_back(FUNCTION_GREATERTHANEQUAL);
	m_functions.push_back(FUNCTION_INVERSE);
	m_functions.push_back(FUNCTION_INVERSESQRT);
	m_functions.push_back(FUNCTION_LDEXP);
	m_functions.push_back(FUNCTION_LESSTHAN);
	m_functions.push_back(FUNCTION_LESSTHANEQUAL);
	m_functions.push_back(FUNCTION_LENGTH);
	m_functions.push_back(FUNCTION_MATRIXCOMPMULT);
	m_functions.push_back(FUNCTION_MAX);
	m_functions.push_back(FUNCTION_MAX_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MIN);
	m_functions.push_back(FUNCTION_MIN_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MIX);
	m_functions.push_back(FUNCTION_MOD);
	m_functions.push_back(FUNCTION_MOD_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MODF);
	m_functions.push_back(FUNCTION_NORMALIZE);
	m_functions.push_back(FUNCTION_NOTEQUAL);
	m_functions.push_back(FUNCTION_OUTERPRODUCT);
	m_functions.push_back(FUNCTION_PACKDOUBLE2X32);
	m_functions.push_back(FUNCTION_REFLECT);
	m_functions.push_back(FUNCTION_REFRACT);
	m_functions.push_back(FUNCTION_ROUND);
	m_functions.push_back(FUNCTION_ROUNDEVEN);
	m_functions.push_back(FUNCTION_SIGN);
	m_functions.push_back(FUNCTION_SMOOTHSTEP);
	m_functions.push_back(FUNCTION_SMOOTHSTEP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_SQRT);
	m_functions.push_back(FUNCTION_STEP);
	m_functions.push_back(FUNCTION_STEP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_TRANSPOSE);
	m_functions.push_back(FUNCTION_TRUNC);
	m_functions.push_back(FUNCTION_UNPACKDOUBLE2X32);
	m_functions.push_back(FUNCTION_ISNAN);
	m_functions.push_back(FUNCTION_ISINF);
}